

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O3

void p_socket_accept_cold_1(void)

{
  PError **in_RDI;
  
  p_error_set_error_p(in_RDI,0x1f6,0,"Socket is already closed");
  return;
}

Assistant:

static pboolean
pp_socket_check (const PSocket *socket,
		  PError	**error)
{
	if (P_UNLIKELY (socket->closed))  {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NOT_AVAILABLE,
				     0,
				     "Socket is already closed");
		return FALSE;
	}

	return TRUE;
}